

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

string * __thiscall
nlohmann::json_abi_v3_11_3::detail::
parser<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<const_char_*>_>
::exception_message(string *__return_storage_ptr__,
                   parser<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<const_char_*>_>
                   *this,token_type expected,string *context)

{
  ulong uVar1;
  char *in_R8;
  char *in_R9;
  char *local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  char *local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b1;
  char *local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_61;
  allocator<char> local_2a;
  undefined1 local_29;
  string *local_28;
  string *context_local;
  parser<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<const_char_*>_>
  *ppStack_18;
  token_type expected_local;
  parser<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<const_char_*>_>
  *this_local;
  string *error_msg;
  
  local_29 = 0;
  local_28 = context;
  context_local._4_4_ = expected;
  ppStack_18 = this;
  this_local = (parser<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<const_char_*>_>
                *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"syntax error ",&local_2a);
  std::allocator<char>::~allocator(&local_2a);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    local_61._M_dataplus = (_Alloc_hider)0x20;
    context = &local_61;
    concat<std::__cxx11::string,char_const(&)[15],std::__cxx11::string_const&,char>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &local_61.field_0x1,(detail *)"while parsing ",(char (*) [15])local_28,context,in_R8)
    ;
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_61.field_0x1)
    ;
    std::__cxx11::string::~string((string *)&local_61.field_0x1);
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"- ");
  if (this->last_token == parse_error) {
    local_90 = lexer<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<const_char_*>_>
               ::get_error_message(&this->m_lexer);
    lexer<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<const_char_*>_>
    ::get_token_string((string *)&local_b1.field_0x1,&this->m_lexer);
    local_b1._M_dataplus = (_Alloc_hider)0x27;
    context = (string *)&local_b1.field_0x1;
    concat<std::__cxx11::string,char_const*,char_const(&)[15],std::__cxx11::string,char>
              (&local_88,(detail *)&local_90,(char **)"; last read: \'",(char (*) [15])context,
               &local_b1,in_R9);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_b1.field_0x1);
  }
  else {
    local_e0 = lexer_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
               ::token_type_name(this->last_token);
    concat<std::__cxx11::string,char_const(&)[12],char_const*>
              (&local_d8,(detail *)"unexpected ",(char (*) [12])&local_e0,(char **)context);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  if (context_local._4_4_ != uninitialized) {
    local_108 = lexer_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                ::token_type_name(context_local._4_4_);
    concat<std::__cxx11::string,char_const(&)[12],char_const*>
              (&local_100,(detail *)"; expected ",(char (*) [12])&local_108,(char **)context);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_100);
    std::__cxx11::string::~string((string *)&local_100);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string exception_message(const token_type expected, const std::string& context)
    {
        std::string error_msg = "syntax error ";

        if (!context.empty())
        {
            error_msg += concat("while parsing ", context, ' ');
        }

        error_msg += "- ";

        if (last_token == token_type::parse_error)
        {
            error_msg += concat(m_lexer.get_error_message(), "; last read: '",
                                m_lexer.get_token_string(), '\'');
        }
        else
        {
            error_msg += concat("unexpected ", lexer_t::token_type_name(last_token));
        }

        if (expected != token_type::uninitialized)
        {
            error_msg += concat("; expected ", lexer_t::token_type_name(expected));
        }

        return error_msg;
    }